

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_window_collapse(nk_context *ctx,char *name,nk_collapse_states c)

{
  int len;
  nk_window *pnVar1;
  int in_EDX;
  char *in_RSI;
  nk_context *in_RDI;
  nk_window *win;
  nk_hash title_hash;
  int title_len;
  
  if (in_RDI != (nk_context *)0x0) {
    len = nk_strlen(in_RSI);
    nk_murmur_hash(in_RSI,len,0x40);
    pnVar1 = nk_find_window(in_RDI,(nk_hash)((ulong)in_RSI >> 0x20),(char *)CONCAT44(in_EDX,len));
    if (pnVar1 != (nk_window *)0x0) {
      if (in_EDX == 0) {
        pnVar1->flags = pnVar1->flags | 0x8000;
      }
      else {
        pnVar1->flags = pnVar1->flags & 0xffff7fff;
      }
    }
  }
  return;
}

Assistant:

NK_API void
nk_window_collapse(struct nk_context *ctx, const char *name,
enum nk_collapse_states c)
{
int title_len;
nk_hash title_hash;
struct nk_window *win;
NK_ASSERT(ctx);
if (!ctx) return;

title_len = (int)nk_strlen(name);
title_hash = nk_murmur_hash(name, (int)title_len, NK_WINDOW_TITLE);
win = nk_find_window(ctx, title_hash, name);
if (!win) return;
if (c == NK_MINIMIZED)
win->flags |= NK_WINDOW_MINIMIZED;
else win->flags &= ~(nk_flags)NK_WINDOW_MINIMIZED;
}